

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestGlobalVC.cxx
# Opt level: O0

void __thiscall
cmCTestGlobalVC::WriteXMLDirectory
          (cmCTestGlobalVC *this,cmXMLWriter *xml,string *path,Directory *dir)

{
  char *this_00;
  string *psVar1;
  char cVar2;
  bool bVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  undefined1 local_d0 [8];
  string full;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestVC::File>
  *f;
  const_iterator __end1;
  const_iterator __begin1;
  Directory *__range1;
  string local_88;
  allocator<char> local_51;
  string local_50;
  char *local_30;
  char *slash;
  Directory *dir_local;
  string *path_local;
  cmXMLWriter *xml_local;
  cmCTestGlobalVC *this_local;
  
  slash = (char *)dir;
  dir_local = (Directory *)path;
  path_local = (string *)xml;
  xml_local = (cmXMLWriter *)this;
  cVar2 = std::__cxx11::string::empty();
  psVar1 = path_local;
  local_30 = "/";
  if (cVar2 != '\0') {
    local_30 = "";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"Directory",&local_51);
  cmXMLWriter::StartElement((cmXMLWriter *)psVar1,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  psVar1 = path_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"Name",(allocator<char> *)((long)&__range1 + 7));
  cmXMLWriter::Element<std::__cxx11::string>
            ((cmXMLWriter *)psVar1,&local_88,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)dir_local);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 7));
  this_00 = slash;
  __end1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestVC::File,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestVC::File>_>_>
           ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestVC::File,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestVC::File>_>_>
                    *)slash);
  f = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestVC::File>
       *)std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestVC::File,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestVC::File>_>_>
         ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestVC::File,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestVC::File>_>_>
                *)this_00);
  while( true ) {
    bVar3 = std::operator!=(&__end1,(_Self *)&f);
    if (!bVar3) break;
    full.field_2._8_8_ =
         std::
         _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestVC::File>_>
         ::operator*(&__end1);
    std::operator+(&local_f0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)dir_local,
                   local_30);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0,
                   &local_f0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   full.field_2._8_8_);
    std::__cxx11::string::~string((string *)&local_f0);
    cmCTestVC::WriteXMLEntry
              (&this->super_cmCTestVC,(cmXMLWriter *)path_local,(string *)dir_local,
               (string *)full.field_2._8_8_,(string *)local_d0,(File *)(full.field_2._8_8_ + 0x20));
    std::__cxx11::string::~string((string *)local_d0);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestVC::File>_>
    ::operator++(&__end1);
  }
  cmXMLWriter::EndElement((cmXMLWriter *)path_local);
  return;
}

Assistant:

void cmCTestGlobalVC::WriteXMLDirectory(cmXMLWriter& xml,
                                        std::string const& path,
                                        Directory const& dir)
{
  const char* slash = path.empty() ? "" : "/";
  xml.StartElement("Directory");
  xml.Element("Name", path);
  for (auto const& f : dir) {
    std::string const full = path + slash + f.first;
    this->WriteXMLEntry(xml, path, f.first, full, f.second);
  }
  xml.EndElement(); // Directory
}